

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Result * __thiscall
Catch::clara::detail::Parser::validate(Result *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer pcVar2;
  pointer pAVar3;
  Opt *opt;
  pointer pOVar4;
  pointer pAVar5;
  
  pOVar4 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar4 != pOVar1) {
    do {
      (*(pOVar4->super_ParserRefImpl<Catch::clara::detail::Opt>).
        super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
                (__return_storage_ptr__,pOVar4);
      if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
           (_func_int **)&PTR__BasicResult_001996c8;
      pcVar2 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(__return_storage_ptr__->m_errorMessage).field_2) {
        operator_delete(pcVar2);
      }
      pOVar4 = pOVar4 + 1;
    } while (pOVar4 != pOVar1);
  }
  pAVar5 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar5 != pAVar3) {
    do {
      (*(pAVar5->super_ParserRefImpl<Catch::clara::detail::Arg>).
        super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase._vptr_ParserBase[2])
                (__return_storage_ptr__,pAVar5);
      if ((__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
           (_func_int **)&PTR__BasicResult_001996c8;
      pcVar2 = (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(__return_storage_ptr__->m_errorMessage).field_2) {
        operator_delete(pcVar2);
      }
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar3);
  }
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001996c8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            for( auto const &opt : m_options ) {
                auto result = opt.validate();
                if( !result )
                    return result;
            }
            for( auto const &arg : m_args ) {
                auto result = arg.validate();
                if( !result )
                    return result;
            }
            return Result::ok();
        }